

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.c
# Opt level: O0

void md5_append(md5_state_t *pms,md5_byte_t *data,size_t nbytes)

{
  uint uVar1;
  ulong uVar2;
  ulong in_RDX;
  void *in_RSI;
  uint *in_RDI;
  size_t copy;
  md5_word_t nbits;
  size_t offset;
  size_t left;
  md5_byte_t *p;
  size_t local_48;
  ulong local_28;
  void *local_20;
  
  uVar2 = (ulong)(*in_RDI >> 3 & 0x3f);
  uVar1 = (uint)(in_RDX << 3);
  if (in_RDX != 0) {
    in_RDI[1] = (int)(in_RDX >> 0x1d) + in_RDI[1];
    *in_RDI = uVar1 + *in_RDI;
    if (*in_RDI < uVar1) {
      in_RDI[1] = in_RDI[1] + 1;
    }
    local_28 = in_RDX;
    local_20 = in_RSI;
    if (uVar2 != 0) {
      local_48 = in_RDX;
      if (0x40 < uVar2 + in_RDX) {
        local_48 = 0x40 - uVar2;
      }
      memcpy((void *)((long)in_RDI + uVar2 + 0x18),in_RSI,local_48);
      if (uVar2 + local_48 < 0x40) {
        return;
      }
      local_20 = (void *)(local_48 + (long)in_RSI);
      local_28 = in_RDX - local_48;
      md5_process((md5_state_t *)nbytes,p);
    }
    for (; 0x3f < local_28; local_28 = local_28 - 0x40) {
      md5_process((md5_state_t *)nbytes,p);
      local_20 = (void *)((long)local_20 + 0x40);
    }
    if (local_28 != 0) {
      memcpy(in_RDI + 6,local_20,local_28);
    }
  }
  return;
}

Assistant:

static void md5_append(md5_state_t* pms, const md5_byte_t* data, size_t nbytes)
{
  const md5_byte_t* p = data;
  size_t left = nbytes;
  size_t offset = (pms->count[0] >> 3) & 63;
  md5_word_t nbits = (md5_word_t)(nbytes << 3);

  if (nbytes <= 0) {
    return;
  }

  /* Update the message length. */
  pms->count[1] += (md5_word_t)(nbytes >> 29);
  pms->count[0] += nbits;
  if (pms->count[0] < nbits) {
    pms->count[1]++;
  }

  /* Process an initial partial block. */
  if (offset) {
    size_t copy = (offset + nbytes > 64 ? 64 - offset : nbytes);

    memcpy(pms->buf + offset, p, copy);
    if (offset + copy < 64) {
      return;
    }
    p += copy;
    left -= copy;
    md5_process(pms, pms->buf);
  }

  /* Process full blocks. */
  for (; left >= 64; p += 64, left -= 64) {
    md5_process(pms, p);
  }

  /* Process a final partial block. */
  if (left) {
    memcpy(pms->buf, p, left);
  }
}